

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

UBool __thiscall icu_63::UVector::equals(UVector *this,UVector *other)

{
  UBool UVar1;
  UElement key;
  int i;
  UVector *other_local;
  UVector *this_local;
  
  if (this->count == other->count) {
    if (this->comparer == (UElementsAreEqual *)0x0) {
      for (key._4_4_ = 0; (int)key._4_4_ < this->count; key._4_4_ = key._4_4_ + 1) {
        if (this->elements[(int)key._4_4_].pointer != other->elements[(int)key._4_4_].pointer) {
          return '\0';
        }
      }
    }
    else {
      for (key._4_4_ = 0; (int)key._4_4_ < this->count; key._4_4_ = key._4_4_ + 1) {
        UVar1 = (*this->comparer)((UElement)(other->elements + (int)key._4_4_),
                                  (UElement)this->elements[(int)key._4_4_].pointer);
        if (UVar1 == '\0') {
          return '\0';
        }
      }
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool   UVector::equals(const UVector &other) const {
    int      i;

    if (this->count != other.count) {
        return FALSE;
    }
    if (comparer == 0) {
        for (i=0; i<count; i++) {
            if (elements[i].pointer != other.elements[i].pointer) {
                return FALSE;
            }
        }
    } else {
        UElement key;
        for (i=0; i<count; i++) {
            key.pointer = &other.elements[i];
            if (!(*comparer)(key, elements[i])) {
                return FALSE;
            }
        }
    }
    return TRUE;
}